

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O3

float * GPU_GetCurrentMatrix(void)

{
  uint uVar1;
  GPU_Context *pGVar2;
  GPU_Target *pGVar3;
  bool bVar4;
  
  pGVar3 = GPU_GetContextTarget();
  if ((pGVar3 != (GPU_Target *)0x0) && (pGVar2 = pGVar3->context, pGVar2 != (GPU_Context *)0x0)) {
    bVar4 = pGVar2->matrix_mode == 0;
    uVar1 = (&pGVar2->projection_matrix)[bVar4].size;
    if (uVar1 != 0) {
      return (&pGVar2->projection_matrix)[bVar4].matrix[uVar1 - 1];
    }
  }
  return (float *)0x0;
}

Assistant:

float* GPU_GetCurrentMatrix(void)
{
    GPU_Target* target = GPU_GetContextTarget();
    GPU_MatrixStack* stack;

    if(target == NULL || target->context == NULL)
        return NULL;
    if(target->context->matrix_mode == GPU_MODELVIEW)
        stack = &target->context->modelview_matrix;
    else
        stack = &target->context->projection_matrix;
    
    if(stack->size == 0)
        return NULL;
    return stack->matrix[stack->size-1];
}